

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basestat.cpp
# Opt level: O3

double MetaSim::BaseStat::t_student(int alfa,int dol)

{
  double dVar1;
  
  dVar1 = -1.0;
  if (0xffffffe1 < dol - 0x1fU) {
    if (alfa == 0x5f) {
      dVar1 = *(double *)(t1_table + (ulong)(dol - 1) * 0x10 + 8);
    }
    else if (alfa == 0x5a) {
      return *(double *)(t1_table + (ulong)(dol - 1) * 0x10);
    }
  }
  return dVar1;
}

Assistant:

double BaseStat::t_student(int alfa, int dol)
    {
        if (dol<1 || dol>30)
            return -1;
        switch (alfa) {
        case 90:
            return t1_table[dol-1][0];
            break;
        case 95:
            return t1_table[dol-1][1];
            break;
        default:
            return -1;
        }
    }